

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  int *piVar1;
  const_iterator __last;
  pointer peVar2;
  entry_type eVar3;
  int32_t iVar4;
  mapped_type *pmVar5;
  pointer piVar6;
  ulong uVar7;
  vector<int,_std::allocator<int>_> *this_00;
  iterator __begin2;
  pointer piVar8;
  long lVar9;
  int32_t j;
  int iVar10;
  int *piVar11;
  int32_t i;
  ulong uVar12;
  int32_t x;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> ngrams;
  
  ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  words.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  words.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  words.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&words,(long)(idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 2);
  std::vector<int,_std::allocator<int>_>::reserve
            (&ngrams,(long)(idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  piVar1 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar11 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start; piVar11 != piVar1; piVar11 = piVar11 + 1) {
    x = *piVar11;
    this_00 = &words;
    if (this->nwords_ <= x) {
      this_00 = &ngrams;
    }
    std::vector<int,_std::allocator<int>_>::push_back(this_00,&x);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (words.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::operator=(idx,&words);
  piVar6 = ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      != ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    iVar10 = 0;
    for (piVar8 = ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar6; piVar8 = piVar8 + 1) {
      x = *piVar8 - this->nwords_;
      pmVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,&x);
      *pmVar5 = iVar10;
      iVar10 = iVar10 + 1;
    }
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)idx,
               (const_iterator)
               (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        ngrams.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
  }
  this->pruneidx_size_ = (this->pruneidx_)._M_h._M_element_count;
  piVar8 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar6 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar6 != piVar8; piVar6 = piVar6 + 1) {
    *piVar6 = -1;
  }
  lVar9 = 0;
  uVar12 = 0;
  iVar10 = 0;
  while( true ) {
    __last._M_current =
         (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)__last._M_current - (long)peVar2) / 0x48) <= uVar12) break;
    eVar3 = getType(this,(int32_t)uVar12);
    uVar7 = (ulong)iVar10;
    if ((eVar3 == label) ||
       ((uVar7 < (ulong)((long)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2) &&
        (uVar12 == (uint)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7])))) {
      peVar2 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      entry::operator=(peVar2 + uVar7,(entry *)((long)&(peVar2->word)._M_dataplus._M_p + lVar9));
      iVar4 = find(this,&(this->words_).
                         super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar7].word);
      (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = iVar10;
      iVar10 = iVar10 + 1;
    }
    uVar12 = uVar12 + 1;
    lVar9 = lVar9 + 0x48;
  }
  iVar10 = (int)((ulong)((long)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)words.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  this->nwords_ = iVar10;
  lVar9 = (long)iVar10 + (long)this->nlabels_;
  this->size_ = (int32_t)lVar9;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::erase
            (&this->words_,peVar2 + lVar9,__last);
  initNgrams(this);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ngrams.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&words.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  words.reserve(idx.size());
  ngrams.reserve(idx.size());
  for (int32_t x : idx) {
    if (x < nwords_) {
      words.push_back(x);
    } else {
      ngrams.push_back(x);
    }
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label ||
        (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ + nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}